

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O2

pseudo_t dmrC_insert_phi_node(dmr_C *C,basic_block *bb,symbol *type)

{
  char cVar1;
  instruction *def;
  char *pcVar2;
  undefined1 local_50 [8];
  ptr_list_iter insniter__;
  
  def = alloc_typed_instruction(C,0x2e,type);
  insniter__._16_8_ = dmrC_alloc_pseudo(C,def);
  (def->field_5).target = (pseudo_t)insniter__._16_8_;
  def->bb = bb;
  ptrlist_forward_iterator((ptr_list_iter *)local_50,(ptr_list *)bb->insns);
  do {
    pcVar2 = (char *)ptrlist_iter_next((ptr_list_iter *)local_50);
    if (pcVar2 == (char *)0x0) {
      ptrlist_add((ptr_list **)&bb->insns,def,&C->ptrlist_allocator);
      return (pseudo_t)insniter__._16_8_;
    }
    cVar1 = *pcVar2;
    if ((cVar1 != '\x01') && (cVar1 != '.')) {
      ptrlist_iter_insert((ptr_list_iter *)local_50,def);
    }
  } while ((cVar1 == '\x01') || (cVar1 == '.'));
  return (pseudo_t)insniter__._16_8_;
}

Assistant:

pseudo_t dmrC_insert_phi_node(struct dmr_C *C, struct basic_block *bb, struct symbol *type)
{
	struct instruction *phi_node = alloc_typed_instruction(C, OP_PHI, type);
	struct instruction *insn;
	pseudo_t phi;

	phi = dmrC_alloc_pseudo(C, phi_node);
	phi_node->target = phi;
	phi_node->bb = bb;

	FOR_EACH_PTR(bb->insns, insn) {
		enum opcode op = insn->opcode;
		if (op == OP_ENTRY || op == OP_PHI)
			continue;
		INSERT_CURRENT(phi_node, insn);
		return phi;
	} END_FOR_EACH_PTR(insn);

	dmrC_add_instruction(C, &bb->insns, phi_node);
	return phi;
}